

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O2

void feat_subvec_project(feat_t *fcb,mfcc_t ***inout_feat,uint32 nfr)

{
  mfcc_t *__src;
  ulong uVar1;
  ulong uVar2;
  mfcc_t *pmVar3;
  int *piVar4;
  ulong uVar5;
  
  if (fcb->subvecs != (int32 **)0x0) {
    for (uVar5 = 0; uVar5 != nfr; uVar5 = uVar5 + 1) {
      __src = fcb->sv_buf;
      uVar1 = (ulong)(uint)fcb->n_sv;
      if (fcb->n_sv < 1) {
        uVar1 = 0;
      }
      pmVar3 = __src;
      for (uVar2 = 0; uVar2 != uVar1; uVar2 = uVar2 + 1) {
        for (piVar4 = fcb->subvecs[uVar2]; (piVar4 != (int *)0x0 && ((long)*piVar4 != -1));
            piVar4 = piVar4 + 1) {
          *pmVar3 = (*inout_feat[uVar5])[*piVar4];
          pmVar3 = pmVar3 + 1;
        }
      }
      memcpy(*inout_feat[uVar5],__src,(long)fcb->sv_dim << 2);
    }
  }
  return;
}

Assistant:

static void
feat_subvec_project(feat_t *fcb, mfcc_t ***inout_feat, uint32 nfr)
{
    uint32 i;

    if (fcb->subvecs == NULL)
        return;
    for (i = 0; i < nfr; ++i) {
        mfcc_t *out;
        int32 j;

        out = fcb->sv_buf;
        for (j = 0; j < fcb->n_sv; ++j) {
            int32 *d;
            for (d = fcb->subvecs[j]; d && *d != -1; ++d) {
                *out++ = inout_feat[i][0][*d];
            }
        }
        memcpy(inout_feat[i][0], fcb->sv_buf, fcb->sv_dim * sizeof(*fcb->sv_buf));
    }
}